

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O3

void __thiscall duckdb::ArenaAllocator::AllocateNewBlock(ArenaAllocator *this,idx_t min_size)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var1;
  ulong uVar2;
  Allocator *allocator;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> this_00;
  ulong uVar3;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> this_01;
  idx_t *piVar4;
  
  _Var1._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  piVar4 = &(_Var1._M_head_impl)->maximum_size;
  if (_Var1._M_head_impl == (ArenaChunk *)0x0) {
    piVar4 = &this->initial_capacity;
  }
  uVar2 = *piVar4;
  uVar3 = 0x1000000;
  if (uVar2 < 0x1000000) {
    uVar3 = uVar2;
  }
  uVar2 = uVar3 << (uVar2 < 0x1000000);
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < min_size);
  allocator = this->allocator;
  this_01._M_head_impl = (ArenaChunk *)operator_new(0x38);
  ArenaChunk::ArenaChunk(this_01._M_head_impl,allocator,uVar3);
  _Var1._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (ArenaChunk *)0x0) {
    this->tail = this_01._M_head_impl;
  }
  else {
    (_Var1._M_head_impl)->prev = this_01._M_head_impl;
    _Var1._M_head_impl =
         (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>
         ._M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>
         .super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
    (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
    .super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
    super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
    this_00._M_head_impl =
         ((this_01._M_head_impl)->next).
         super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
         super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
         super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
    ((this_01._M_head_impl)->next).
    super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
    super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
    super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (this_00._M_head_impl != (ArenaChunk *)0x0) {
      ArenaChunk::~ArenaChunk(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl);
      _Var1._M_head_impl =
           (this->head).
           super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
           super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
           super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
      (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
      _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
      super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = this_01._M_head_impl;
      if (_Var1._M_head_impl != (ArenaChunk *)0x0) {
        ArenaChunk::~ArenaChunk(_Var1._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
      goto LAB_01115bb1;
    }
  }
  (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = this_01._M_head_impl;
LAB_01115bb1:
  this->allocated_size = this->allocated_size + uVar3;
  return;
}

Assistant:

void ArenaAllocator::AllocateNewBlock(idx_t min_size) {
	idx_t capacity;
	// start off with either (1) initial capacity (if we have no block) or (2) capacity of the previous block
	if (!head) {
		capacity = initial_capacity;
	} else {
		capacity = head->maximum_size;
	}
	// capacity of the previous block can be bigger than the max capacity if we allocate len > max capacity
	// for new blocks - try to set it back to the max capacity
	if (capacity > ARENA_ALLOCATOR_MAX_CAPACITY) {
		capacity = ARENA_ALLOCATOR_MAX_CAPACITY;
	}
	// if we are below the max capacity - double the size of the block
	if (capacity < ARENA_ALLOCATOR_MAX_CAPACITY) {
		capacity *= 2;
	}
	// we double the size until we can fit `len`
	// this is generally only relevant if len is very large
	while (capacity < min_size) {
		capacity *= 2;
	}
	auto new_chunk = make_unsafe_uniq<ArenaChunk>(allocator, capacity);
	if (head) {
		head->prev = new_chunk.get();
		new_chunk->next = std::move(head);
	} else {
		tail = new_chunk.get();
	}
	head = std::move(new_chunk);
	allocated_size += capacity;
}